

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O0

uint8_t * __thiscall flatbuffers::vector_downward::make_space(vector_downward *this,size_t len)

{
  size_t sVar1;
  uoffset_t uVar2;
  unsigned_long *puVar3;
  uint8_t *puVar4;
  ulong uVar5;
  uint8_t *new_cur;
  uint8_t *new_buf;
  uoffset_t local_1c;
  size_t sStack_18;
  uoffset_t old_size;
  size_t len_local;
  vector_downward *this_local;
  
  sStack_18 = len;
  len_local = (size_t)this;
  if (this->cur_ + -len < this->buf_) {
    local_1c = size(this);
    new_buf = (uint8_t *)growth_policy(this,this->reserved_);
    puVar3 = std::max<unsigned_long>(&stack0xffffffffffffffe8,(unsigned_long *)&new_buf);
    this->reserved_ = *puVar3 + this->reserved_;
    puVar4 = (uint8_t *)operator_new__(this->reserved_);
    sVar1 = this->reserved_;
    uVar5 = (ulong)local_1c;
    memcpy(puVar4 + (sVar1 - uVar5),this->cur_,(ulong)local_1c);
    this->cur_ = puVar4 + (sVar1 - uVar5);
    if (this->buf_ != (uint8_t *)0x0) {
      operator_delete__(this->buf_);
    }
    this->buf_ = puVar4;
  }
  this->cur_ = this->cur_ + -sStack_18;
  uVar2 = size(this);
  if (uVar2 < 0x7fffffff) {
    return this->cur_;
  }
  __assert_fail("size() < (1UL << (sizeof(soffset_t) * 8 - 1)) - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                ,0xe1,"uint8_t *flatbuffers::vector_downward::make_space(size_t)");
}

Assistant:

uint8_t *make_space(size_t len) {
    if (buf_ > cur_ - len) {
      auto old_size = size();
      reserved_ += std::max(len, growth_policy(reserved_));
      auto new_buf = new uint8_t[reserved_];
      auto new_cur = new_buf + reserved_ - old_size;
      memcpy(new_cur, cur_, old_size);
      cur_ = new_cur;
      delete[] buf_;
      buf_ = new_buf;
    }
    cur_ -= len;
    // Beyond this, signed offsets may not have enough range:
    // (FlatBuffers > 2GB not supported).
    assert(size() < (1UL << (sizeof(soffset_t) * 8 - 1)) - 1);
    return cur_;
  }